

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

void BinaryenAddTagImport
               (BinaryenModuleRef module,char *internalName,char *externalModuleName,
               char *externalBaseName,BinaryenType params,BinaryenType results)

{
  BinaryenType BVar1;
  Global *pGVar2;
  string_view local_68;
  BinaryenType local_58;
  BinaryenType local_50;
  Name local_48;
  _Head_base<0UL,_wasm::Tag_*,_false> local_38;
  __single_object tag;
  
  local_58 = results;
  local_50 = params;
  wasm::Name::Name((Name *)&local_68,internalName);
  pGVar2 = wasm::Module::getGlobalOrNull(module,(Name)local_68);
  BVar1 = local_58;
  if (pGVar2 == (Global *)0x0) {
    std::make_unique<wasm::Tag>();
    wasm::Name::Name(&local_48,internalName);
    ((local_38._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_len =
         local_48.super_IString.str._M_len;
    ((local_38._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_str =
         local_48.super_IString.str._M_str;
    wasm::Name::Name(&local_48,externalModuleName);
    ((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_len =
         local_48.super_IString.str._M_len;
    ((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_str =
         local_48.super_IString.str._M_str;
    wasm::Name::Name(&local_48,externalBaseName);
    ((local_38._M_head_impl)->super_Importable).base.super_IString.str._M_len =
         local_48.super_IString.str._M_len;
    ((local_38._M_head_impl)->super_Importable).base.super_IString.str._M_str =
         local_48.super_IString.str._M_str;
    ((local_38._M_head_impl)->sig).params.id = local_50;
    ((local_38._M_head_impl)->sig).results.id = BVar1;
    wasm::Module::addTag(module,(unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *)&local_38)
    ;
    std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::~unique_ptr
              ((unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *)&local_38);
  }
  else {
    wasm::Name::Name(&local_48,externalModuleName);
    (pGVar2->super_Importable).module.super_IString.str._M_len = local_48.super_IString.str._M_len;
    (pGVar2->super_Importable).module.super_IString.str._M_str = local_48.super_IString.str._M_str;
    wasm::Name::Name(&local_48,externalBaseName);
    (pGVar2->super_Importable).base.super_IString.str._M_len = local_48.super_IString.str._M_len;
    (pGVar2->super_Importable).base.super_IString.str._M_str = local_48.super_IString.str._M_str;
  }
  return;
}

Assistant:

void BinaryenAddTagImport(BinaryenModuleRef module,
                          const char* internalName,
                          const char* externalModuleName,
                          const char* externalBaseName,
                          BinaryenType params,
                          BinaryenType results) {
  auto* tag = ((Module*)module)->getGlobalOrNull(internalName);
  if (tag == nullptr) {
    auto tag = std::make_unique<Tag>();
    tag->name = internalName;
    tag->module = externalModuleName;
    tag->base = externalBaseName;
    tag->sig = Signature(Type(params), Type(results));
    ((Module*)module)->addTag(std::move(tag));
  } else {
    // already exists so just set module and base
    tag->module = externalModuleName;
    tag->base = externalBaseName;
  }
}